

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonReader.h
# Opt level: O3

void __thiscall Json::JsonReader::JsonReader(JsonReader *this,ifstream *ifs)

{
  char cVar1;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  (this->__JSON)._M_dataplus._M_p = (pointer)&(this->__JSON).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)this,local_40,local_38 + (long)local_40);
  this->__ptr = 0;
  this->__len = (int)(this->__JSON)._M_string_length;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      cVar1 = std::istream::get();
      if (cVar1 == -1) break;
      std::__cxx11::string::push_back((char)this);
    }
    this->__len = (int)(this->__JSON)._M_string_length;
  }
  return;
}

Assistant:

explicit JsonReader(std::ifstream &ifs) : JsonReader("") {
            if (ifs.is_open()) {
                char c;
                while ((c = ifs.get()) != EOF) __JSON += c;
                __len = __JSON.size();
            }
        }